

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

void Aig_ManRegPartitionTraverse_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vLos)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    if ((*(uint *)&pObj->field_0x18 & 7) == 2) break;
    Aig_ManRegPartitionTraverse_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLos)
    ;
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  if ((pObj->field_5).iData < p->nObjs[2] - p->nRegs) {
    return;
  }
  uVar1 = vLos->nCap;
  if (vLos->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vLos->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vLos->pArray,0x80);
      }
      vLos->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_006c74ab;
      if (vLos->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vLos->pArray,(ulong)uVar1 << 4);
      }
      vLos->pArray = ppvVar2;
    }
    vLos->nCap = iVar3;
  }
LAB_006c74ab:
  iVar3 = vLos->nSize;
  vLos->nSize = iVar3 + 1;
  vLos->pArray[iVar3] = pObj;
  printf("%d ",(ulong)(uint)(((pObj->field_5).iData - p->nObjs[2]) + p->nRegs));
  return;
}

Assistant:

void Aig_ManRegPartitionTraverse_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vLos )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( pObj->iData >= Aig_ManCiNum(p) - Aig_ManRegNum(p) )
        {
            Vec_PtrPush( vLos, pObj );
            printf( "%d ", pObj->iData - (Aig_ManCiNum(p) - Aig_ManRegNum(p)) );
        }
        return;
    }
    Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin0(pObj), vLos );
    Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin1(pObj), vLos );
}